

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretDiv
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  Trace *this_00;
  anon_union_8_2_3d487603_for_CharStringOperand_1 *paVar4;
  reference pvVar5;
  double local_88;
  double local_78;
  undefined1 local_60 [8];
  CharStringOperand newOperand;
  CharStringOperand valueB;
  CharStringOperand valueA;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x21])();
  if (iVar2 == 0) {
    sVar3 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                      (&this->mOperandStack);
    if (sVar3 < 2) {
      this_00 = Trace::DefaultTrace();
      sVar3 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                        (&this->mOperandStack);
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting"
                        ,sVar3);
      this_local = (CharStringType2Interpreter *)0x0;
    }
    else {
      paVar4 = (anon_union_8_2_3d487603_for_CharStringOperand_1 *)
               std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      newOperand.field_1 = *paVar4;
      local_88 = (double)paVar4[1].IntegerValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      pvVar5 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      vVar1 = *pvVar5;
      local_78 = (double)(pvVar5->field_1).IntegerValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      if ((((undefined1  [16])vVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         ((newOperand.field_1.IntegerValue & 1U) == 0)) {
        local_60[0] = false;
        if (((undefined1  [16])vVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_78 = (double)(long)local_78;
        }
        if ((newOperand.field_1.IntegerValue & 1U) != 0) {
          local_88 = (double)(long)local_88;
        }
        newOperand._0_8_ = local_78 / local_88;
      }
      else {
        local_60[0] = true;
        newOperand._0_8_ = (long)local_78 / (long)local_88;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,(value_type *)local_60);
      this_local = (CharStringType2Interpreter *)inProgramCounter;
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretDiv(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Div(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;


	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	if(!valueA.IsInteger || !valueB.IsInteger)
	{
		newOperand.IsInteger = false;
		newOperand.RealValue = 
			(valueA.IsInteger ? (double)valueA.IntegerValue : valueA.RealValue)
			/
			(valueB.IsInteger ? (double)valueB.IntegerValue : valueB.RealValue);
	}
	else
	{
		newOperand.IsInteger = true;
		newOperand.IntegerValue = valueA.IntegerValue / valueB.IntegerValue;
	}
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}